

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

void __thiscall cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  iterator *this_local;
  
  if (this->Tree == (cmLinkedTree<cmState::PolicyStackEntry> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x41,
                  "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
                 );
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar3 = std::vector<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>::size
                    (&this->Tree->Data);
  if (sVar2 != sVar3) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x42,
                  "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
                 );
  }
  uVar1 = this->Position;
  sVar2 = std::vector<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>::size
                    (&this->Tree->Data);
  if (sVar2 < uVar1) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x43,
                  "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
                 );
  }
  if (this->Position != 0) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->Tree->UpPositions,this->Position - 1);
    this->Position = *pvVar4;
    return;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0x44,
                "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
               );
}

Assistant:

void operator++()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      this->Position = this->Tree->UpPositions[this->Position - 1];
    }